

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.h
# Opt level: O1

void __thiscall Channel::handleEvents(Channel *this)

{
  uint uVar1;
  
  this->events_ = 0;
  uVar1 = this->revents_;
  if ((uVar1 & 0x11) != 0x10) {
    if ((uVar1 & 8) == 0) {
      if ((uVar1 & 0x2003) != 0) {
        handleRead(this);
      }
      if ((this->revents_ & 4) != 0) {
        handleWrite(this);
      }
      handleConn(this);
      return;
    }
    if ((this->errorHandler_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->errorHandler_)._M_invoker)((_Any_data *)&this->errorHandler_);
    }
  }
  this->events_ = 0;
  return;
}

Assistant:

void handleEvents(){
        events_=0;
        if((revents_&EPOLLHUP)&&!(revents_&EPOLLIN)){
            events_=0;
            return;
        }
        if(revents_&EPOLLERR){
            if(errorHandler_) errorHandler_();
            events_=0;
            return;
        }
        if (revents_&(EPOLLIN|EPOLLPRI|EPOLLRDHUP)) {
            handleRead();
        }
        if(revents_&(EPOLLOUT)){
            handleWrite();
        }
        handleConn();
    }